

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdflogger-c.cc
# Opt level: O0

void set_log_dest(QPDFLogger *l,offset_in_QPDFLogger_to_subr method,qpdf_log_dest_e dest,
                 char *identifier,qpdf_log_fn_t fn,void *udata)

{
  undefined4 in_register_00000014;
  void *in_stack_00000008;
  _Mem_fn<void_(QPDFLogger::*)(std::shared_ptr<Pipeline>)> local_90;
  type local_80;
  function<void_(std::shared_ptr<Pipeline>)> local_68;
  qpdf_log_fn_t local_48;
  qpdf_log_fn_t fn_local;
  char *identifier_local;
  offset_in_QPDFLogger_to_subr oStack_30;
  qpdf_log_dest_e dest_local;
  offset_in_QPDFLogger_to_subr method_local;
  QPDFLogger *local_20;
  QPDFLogger *l_local;
  offset_in_QPDFLogger_to_subr local_10;
  
  method_local = CONCAT44(in_register_00000014,dest);
  identifier_local._4_4_ = (qpdf_log_dest_e)identifier;
  local_48 = (qpdf_log_fn_t)udata;
  fn_local = fn;
  oStack_30 = method;
  local_20 = l;
  l_local = (QPDFLogger *)method;
  local_10 = method_local;
  local_90.super__Mem_fn_base<void_(QPDFLogger::*)(std::shared_ptr<Pipeline>),_true>._M_pmf =
       (offset_in_QPDFLogger_to_subr)
       std::mem_fn<void(std::shared_ptr<Pipeline>),QPDFLogger>
                 ((_Mem_fn<void_(QPDFLogger::*)(std::shared_ptr<Pipeline>)> *)method,method_local);
  std::
  bind<std::_Mem_fn<void(QPDFLogger::*)(std::shared_ptr<Pipeline>)>,QPDFLogger*&,std::_Placeholder<1>const&>
            (&local_80,&local_90,&local_20,(_Placeholder<1> *)&std::placeholders::_1);
  std::function<void(std::shared_ptr<Pipeline>)>::
  function<std::_Bind<std::_Mem_fn<void(QPDFLogger::*)(std::shared_ptr<Pipeline>)>(QPDFLogger*,std::_Placeholder<1>)>,void>
            ((function<void(std::shared_ptr<Pipeline>)> *)&local_68,&local_80);
  set_log_dest(l,&local_68,identifier_local._4_4_,(char *)fn_local,local_48,in_stack_00000008);
  std::function<void_(std::shared_ptr<Pipeline>)>::~function(&local_68);
  return;
}

Assistant:

static void
set_log_dest(
    QPDFLogger* l,
    void (QPDFLogger::*method)(std::shared_ptr<Pipeline>),
    qpdf_log_dest_e dest,
    char const* identifier,
    qpdf_log_fn_t fn,
    void* udata)
{
    set_log_dest(
        l, std::bind(std::mem_fn(method), l, std::placeholders::_1), dest, identifier, fn, udata);
}